

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dacload.c
# Opt level: O3

void envy_bios_print_dacload(envy_bios *bios,FILE *out,uint mask)

{
  byte bVar1;
  ushort uVar2;
  envy_bios_bit_entry *peVar3;
  envy_bios_dacload_entry *peVar4;
  ulong uVar5;
  ulong uVar6;
  
  if ((mask & 0x20) != 0) {
    if ((bios->dacload).bit != (envy_bios_bit_entry *)0x0) {
      fprintf((FILE *)out,"BIT \'A\' unk02 0x%02x\n",(ulong)(bios->dacload).unk02);
      peVar3 = (bios->dacload).bit;
      envy_bios_dump_hex(bios,out,(uint)peVar3->t_offset,(uint)peVar3->t_len,mask);
    }
    uVar2 = (bios->dacload).offset;
    if (uVar2 != 0) {
      bVar1 = (bios->dacload).version;
      uVar6 = (ulong)(bVar1 >> 4);
      uVar5 = (ulong)(bVar1 & 0xf);
      if ((bios->dacload).valid != '\0') {
        fprintf((FILE *)out,"DACLOAD table at 0x%04x version %d.%d\n",(ulong)uVar2,uVar6,uVar5);
        envy_bios_dump_hex(bios,out,(uint)(bios->dacload).offset,(uint)(bios->dacload).hlen,mask);
        if ((bios->dacload).entriesnum != '\0') {
          uVar6 = 0;
          do {
            peVar4 = (bios->dacload).entries;
            fprintf((FILE *)out,"DACLOAD %d: 0x%08x\n",uVar6 & 0xffffffff,(ulong)peVar4[uVar6].val);
            envy_bios_dump_hex(bios,out,(uint)peVar4[uVar6].offset,(uint)(bios->dacload).rlen,mask);
            uVar6 = uVar6 + 1;
          } while (uVar6 < (bios->dacload).entriesnum);
        }
        fputc(10,(FILE *)out);
        return;
      }
      fprintf((FILE *)out,"Failed to parse DACLOAD table at 0x%04x version %d.%d\n\n",(ulong)uVar2,
              uVar6,uVar5);
      return;
    }
  }
  return;
}

Assistant:

void envy_bios_print_dacload (struct envy_bios *bios, FILE *out, unsigned mask) {
	struct envy_bios_dacload *dacload = &bios->dacload;
	if (!(mask & ENVY_BIOS_PRINT_DACLOAD))
		return;
	if (dacload->bit) {
		fprintf(out, "BIT 'A' unk02 0x%02x\n", dacload->unk02);
		envy_bios_dump_hex(bios, out, dacload->bit->t_offset, dacload->bit->t_len, mask);
	}
	if (!dacload->offset)
		return;
	if (!dacload->valid) {
		fprintf(out, "Failed to parse DACLOAD table at 0x%04x version %d.%d\n\n", dacload->offset, dacload->version >> 4, dacload->version & 0xf);
		return;
	}
	fprintf(out, "DACLOAD table at 0x%04x version %d.%d\n", dacload->offset, dacload->version >> 4, dacload->version & 0xf);
	envy_bios_dump_hex(bios, out, dacload->offset, dacload->hlen, mask);
	int i;
	for (i = 0; i < dacload->entriesnum; i++) {
		struct envy_bios_dacload_entry *entry = &dacload->entries[i];
		fprintf(out, "DACLOAD %d: 0x%08x\n", i, entry->val);
		envy_bios_dump_hex(bios, out, entry->offset, dacload->rlen, mask);
	}
	fprintf(out, "\n");
}